

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void set_cpu_mapping(uint32_t id,cpu_mapping *mapping)

{
  uint32_t uVar1;
  uint32_t preallocated;
  cpu_mapping *mapping_local;
  uint32_t id_local;
  
  uVar1 = preallocated_cpu_mappings;
  if ((max_id == 0xffffffff) || (max_id < id)) {
    max_id = id;
  }
  if (preallocated_cpu_mappings <= id) {
    if ((preallocated_cpu_mappings == 0) && (preallocated_cpu_mappings = id, id < 5)) {
      preallocated_cpu_mappings = 4;
    }
    preallocated_cpu_mappings = preallocated_cpu_mappings << 1;
    cpu_mappings = (cpu_mapping **)realloc(cpu_mappings,(ulong)preallocated_cpu_mappings << 3);
    memset(cpu_mappings + uVar1,0,(ulong)(preallocated_cpu_mappings - uVar1) << 3);
  }
  cpu_mappings[id] = mapping;
  return;
}

Assistant:

void set_cpu_mapping(uint32_t id, struct cpu_mapping *mapping)
{
	if (max_id == UINT32_MAX || id > max_id)
		max_id = id;

	if (id >= preallocated_cpu_mappings)
	{
		uint32_t preallocated = preallocated_cpu_mappings;
		if (preallocated_cpu_mappings == 0)
		{
			if (id > 4)
				preallocated_cpu_mappings = id;
			else
				preallocated_cpu_mappings = 4;
		}
		preallocated_cpu_mappings *= 2;

		cpu_mappings = realloc(cpu_mappings,
				sizeof(void *) * preallocated_cpu_mappings);
		memset(&cpu_mappings[preallocated], 0,
				sizeof(void *) * (preallocated_cpu_mappings - preallocated));
	}

	cpu_mappings[id] = mapping;
}